

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

string * __thiscall
glcts::TextureBufferTextureBufferRange::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferTextureBufferRange *this,FormatInfo *info)

{
  GLenum GVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_220;
  string local_200;
  string local_1e0;
  char *local_1b0;
  char *pszInterpolationQualifier;
  stringstream result;
  ostream local_198;
  FormatInfo *local_20;
  FormatInfo *info_local;
  TextureBufferTextureBufferRange *this_local;
  
  local_20 = info;
  info_local = (FormatInfo *)this;
  this_local = (TextureBufferTextureBufferRange *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&pszInterpolationQualifier);
  local_1b0 = "";
  GVar1 = FormatInfo::get_output_type(local_20);
  if (GVar1 != 0x1405) {
    GVar1 = FormatInfo::get_output_type(local_20);
    if (GVar1 != 0x1404) goto LAB_015634f5;
  }
  local_1b0 = "flat ";
LAB_015634f5:
  poVar2 = std::operator<<(&local_198,
                           "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nuniform highp "
                          );
  FormatInfo::get_sampler_type_name_abi_cxx11_(&local_1e0,local_20);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,
                           " sampler_buffer;\n\nlayout(location = 0 ) out flat int outTextureSize;\nlayout(location = 1 ) out "
                          );
  poVar2 = std::operator<<(poVar2,local_1b0);
  FormatInfo::get_output_type_name_abi_cxx11_(&local_200,local_20);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,
                           " outValue;\nvoid main(void)\n{\n    outValue       = texelFetch ( sampler_buffer, 0)"
                          );
  FormatInfo::get_value_selector_abi_cxx11_(&local_220,local_20);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,
                  ";\n    outTextureSize = textureSize( sampler_buffer );\n    gl_Position    = vec4(0.0f, 0.0f, 0.0f, 0.0f);\n}\n"
                 );
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&pszInterpolationQualifier);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferTextureBufferRange::getVertexShaderCode(FormatInfo& info) const
{
	std::stringstream result;

	const char* pszInterpolationQualifier = "";

	if (info.get_output_type() == GL_UNSIGNED_INT || info.get_output_type() == GL_INT)
	{
		pszInterpolationQualifier = "flat ";
	}

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "uniform highp "
		   << info.get_sampler_type_name().c_str() << " sampler_buffer;\n"
													  "\n"
													  "layout(location = 0 ) out flat int outTextureSize;\n"
													  "layout(location = 1 ) out "
		   << pszInterpolationQualifier << info.get_output_type_name().c_str()
		   << " outValue;\n"
			  "void main(void)\n"
			  "{\n"
			  "    outValue       = texelFetch ( sampler_buffer, 0)"
		   << info.get_value_selector().c_str() << ";\n"
												   "    outTextureSize = textureSize( sampler_buffer );\n"
												   "    gl_Position    = vec4(0.0f, 0.0f, 0.0f, 0.0f);\n"
												   "}\n";

	return result.str();
}